

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrBasic.c
# Opt level: O2

void Mtr_MakeNextSibling(MtrNode *first,MtrNode *second)

{
  MtrNode *pMVar1;
  
  pMVar1 = first->younger;
  second->younger = pMVar1;
  if (pMVar1 != (MtrNode *)0x0) {
    pMVar1->elder = second;
  }
  second->parent = first->parent;
  first->younger = second;
  second->elder = first;
  return;
}

Assistant:

void
Mtr_MakeNextSibling(
  MtrNode * first,
  MtrNode * second)
{
    second->younger = first->younger;
    if (first->younger != NULL) {
        first->younger->elder = second;
    }
    second->parent = first->parent;
    first->younger = second;
    second->elder = first;
    return;

}